

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementMeta.h
# Opt level: O3

void __thiscall Rml::ElementMeta::ElementMeta(ElementMeta *this,Element *el)

{
  (this->attribute_event_listeners).m_container.
  super__Vector_base<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attribute_event_listeners).m_container.
  super__Vector_base<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->attribute_event_listeners).m_container.
  super__Vector_base<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  EventDispatcher::EventDispatcher(&this->event_dispatcher,el);
  ElementStyle::ElementStyle(&this->style,el);
  ElementBackgroundBorder::ElementBackgroundBorder(&this->background_border);
  ElementEffects::ElementEffects(&this->effects,el);
  ElementScroll::ElementScroll(&this->scroll,el);
  Style::ComputedValues::ComputedValues(&this->computed_values,el);
  return;
}

Assistant:

explicit ElementMeta(Element* el) : event_dispatcher(el), style(el), background_border(), effects(el), scroll(el), computed_values(el) {}